

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O2

int HashInStdResTbl(char *s)

{
  uint uVar1;
  
  uVar1 = 0;
  for (; *s != '\0'; s = s + 1) {
    uVar1 = uVar1 * 0x10 + (int)*s;
    uVar1 = uVar1 & 0xfffffff ^ uVar1 >> 0x18 & 0xfffffff0;
  }
  return uVar1 % 0xa39;
}

Assistant:

int HashInStdResTbl(char *s) {
   unsigned h, g;

   for (h = 0; *s != '\0'; s++) {
      h = (h<<4) + *s;
      if ( (g = h & 0xf0000000) ) {
	 h ^= g >> 24;
	 h ^= g;
      }
   }
   return h % M;
}